

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O0

void __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
::InitOwnOptions(FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                 *this)

{
  ValueArrayRef values;
  ValueArrayRef values_00;
  ValueArrayRef values_01;
  initializer_list<mp::SolveResultRegistry::RegEntry> __l;
  int iVar1;
  Env *pEVar2;
  char *description;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_RDI;
  EnvKeeper *this_00;
  int *in_stack_fffffffffffffd28;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd38;
  int in_stack_fffffffffffffd3c;
  undefined6 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd46;
  undefined1 in_stack_fffffffffffffd47;
  Env *in_stack_fffffffffffffd48;
  SolverOptionManager *in_stack_fffffffffffffd50;
  BasicFlatConverter *in_stack_fffffffffffffd58;
  undefined8 ***pppuVar3;
  SolverOptionManager *in_stack_fffffffffffffd60;
  undefined8 ***pppuVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd70;
  allocator_type *__a;
  char *in_stack_fffffffffffffd78;
  int __val;
  string *this_01;
  SolverOptionManager *in_stack_fffffffffffffd80;
  SolverOptionManager *this_02;
  OptionValueInfo *in_stack_fffffffffffffd88;
  iterator value;
  undefined8 in_stack_fffffffffffffd90;
  int *name;
  SolverOptionManager *in_stack_fffffffffffffda0;
  undefined1 ifCanReplace;
  SRRegMap *sm;
  SolveResultRegistry *this_03;
  allocator_type local_19c [2];
  undefined1 local_19a;
  undefined1 local_199 [33];
  undefined8 **local_178;
  undefined1 **local_170 [5];
  undefined8 **local_148;
  undefined8 local_140;
  ValueArrayRef local_108;
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  ValueArrayRef local_98 [2];
  string local_78 [32];
  string local_58 [32];
  undefined1 local_38 [56];
  
  GetModelAPI(in_RDI);
  EnvKeeper::GetEnv(&in_RDI->super_EnvKeeper);
  ConstraintManager::ConsiderAcceptanceOptions
            ((ConstraintManager *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
             (BasicFlatModelAPI *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  EnvKeeper::GetEnv(&in_RDI->super_EnvKeeper);
  ValueArrayRef::ValueArrayRef((ValueArrayRef *)(local_38 + 0x20));
  values._8_8_ = in_stack_fffffffffffffd90;
  values.values_ = in_stack_fffffffffffffd88;
  SolverOptionManager::AddStoredOption<std::__cxx11::string>
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,(char *)in_stack_fffffffffffffd70,
             in_stack_fffffffffffffd68,values);
  EnvKeeper::GetEnv(&in_RDI->super_EnvKeeper);
  SolverOptionManager::AddOption<int>
            ((SolverOptionManager *)
             CONCAT17(in_stack_fffffffffffffd47,
                      CONCAT16(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40)),
             (char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
             (char *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,0,0x672622);
  EnvKeeper::GetEnv(&in_RDI->super_EnvKeeper);
  SolverOptionManager::AddOption<int>
            ((SolverOptionManager *)
             CONCAT17(in_stack_fffffffffffffd47,
                      CONCAT16(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40)),
             (char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
             (char *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,0,0x67266c);
  EnvKeeper::GetEnv(&in_RDI->super_EnvKeeper);
  SolverOptionManager::AddOption<int>
            ((SolverOptionManager *)
             CONCAT17(in_stack_fffffffffffffd47,
                      CONCAT16(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40)),
             (char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
             (char *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,0,0x6726b6);
  EnvKeeper::GetEnv(&in_RDI->super_EnvKeeper);
  SolverOptionManager::AddOption<int>
            ((SolverOptionManager *)
             CONCAT17(in_stack_fffffffffffffd47,
                      CONCAT16(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40)),
             (char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
             (char *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,0,0x672700);
  EnvKeeper::GetEnv(&in_RDI->super_EnvKeeper);
  SolverOptionManager::AddOption<int>
            ((SolverOptionManager *)
             CONCAT17(in_stack_fffffffffffffd47,
                      CONCAT16(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40)),
             (char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
             (char *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,0,0x67274a);
  EnvKeeper::GetEnv(&in_RDI->super_EnvKeeper);
  SolverOptionManager::AddOption<int>
            ((SolverOptionManager *)
             CONCAT17(in_stack_fffffffffffffd47,
                      CONCAT16(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40)),
             (char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
             (char *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,0,0x672794);
  EnvKeeper::GetEnv(&in_RDI->super_EnvKeeper);
  ModelAPIAcceptsQuadObj();
  SolverOptionManager::AddOption<int>
            ((SolverOptionManager *)
             CONCAT17(in_stack_fffffffffffffd47,
                      CONCAT16(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40)),
             (char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
             (char *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,0,0x672819);
  EnvKeeper::GetEnv(&in_RDI->super_EnvKeeper);
  SolverOptionManager::AddOption<int>
            ((SolverOptionManager *)
             CONCAT17(in_stack_fffffffffffffd47,
                      CONCAT16(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40)),
             (char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
             (char *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,0,0x672863);
  EnvKeeper::GetEnv(&in_RDI->super_EnvKeeper);
  SolverOptionManager::AddOption<int>
            ((SolverOptionManager *)
             CONCAT17(in_stack_fffffffffffffd47,
                      CONCAT16(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40)),
             (char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
             (char *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,0,0x6728ad);
  EnvKeeper::GetEnv(&in_RDI->super_EnvKeeper);
  SolverOptionManager::AddOption<double>
            (in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48,
             (char *)CONCAT17(in_stack_fffffffffffffd47,
                              CONCAT16(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40)),
             (double *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
             (double)in_stack_fffffffffffffd30,(double)in_stack_fffffffffffffd28);
  EnvKeeper::GetEnv(&in_RDI->super_EnvKeeper);
  ModelAPIAcceptsExponentialCones
            ((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              *)0x672926);
  SolverOptionManager::AddOption<int>
            ((SolverOptionManager *)
             CONCAT17(in_stack_fffffffffffffd47,
                      CONCAT16(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40)),
             (char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
             (char *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,0,0x672981);
  iVar1 = ModelAPIAcceptsExponentialCones
                    ((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                      *)0x67298e);
  (in_RDI->options_).passExpCones_ = iVar1;
  DefaultSOCPMode(in_stack_fffffffffffffd30);
  std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffd78 >> 0x20));
  std::operator+((char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd30);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                 (char *)in_stack_fffffffffffffd30);
  this_03 = (SolveResultRegistry *)local_38;
  std::__cxx11::string::operator=((string *)&in_RDI->socp_mode_text_,(string *)this_03);
  std::__cxx11::string::~string((string *)this_03);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_78);
  EnvKeeper::GetEnv(&in_RDI->super_EnvKeeper);
  std::__cxx11::string::c_str();
  ValueArrayRef::ValueArrayRef<3>(local_98,&in_RDI->socp_values_,0);
  values_00._8_8_ = in_stack_fffffffffffffd90;
  values_00.values_ = in_stack_fffffffffffffd88;
  SolverOptionManager::AddStoredOption<int>
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,(char *)in_stack_fffffffffffffd70,
             (int *)in_stack_fffffffffffffd68,values_00);
  __val = (int)((ulong)in_stack_fffffffffffffd78 >> 0x20);
  iVar1 = DefaultSOCPMode(in_stack_fffffffffffffd30);
  (in_RDI->options_).passSOCPCones_ = iVar1;
  DefaultSOCP2QCMode(in_stack_fffffffffffffd30);
  std::__cxx11::to_string(__val);
  std::operator+((char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd30);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                 (char *)in_stack_fffffffffffffd30);
  this_02 = (SolverOptionManager *)&in_RDI->socp2qc_mode_text_;
  this_01 = local_b8;
  std::__cxx11::string::operator=((string *)this_02,this_01);
  std::__cxx11::string::~string(this_01);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_f8);
  this_00 = &in_RDI->super_EnvKeeper;
  pEVar2 = EnvKeeper::GetEnv(this_00);
  value = (iterator)&pEVar2->super_SolverOptionManager;
  description = (char *)std::__cxx11::string::c_str();
  name = &(in_RDI->options_).passSOCP2QC_;
  ValueArrayRef::ValueArrayRef<3>(&local_108,&in_RDI->socp2qc_values_,0);
  values_01._8_8_ = description;
  values_01.values_ = (OptionValueInfo *)value;
  SolverOptionManager::AddStoredOption<int>
            (this_02,(char *)this_01,(char *)in_stack_fffffffffffffd70,
             (int *)in_stack_fffffffffffffd68,values_01);
  iVar1 = DefaultSOCP2QCMode(in_stack_fffffffffffffd30);
  (in_RDI->options_).passSOCP2QC_ = iVar1;
  EnvKeeper::GetEnv(this_00);
  SolverOptionManager::AddStoredOption<int>
            (in_stack_fffffffffffffda0,(char *)name,description,&value->first_,
             (int)((ulong)this_02 >> 0x20),(int)this_02);
  EnvKeeper::GetEnv(this_00);
  SolverOptionManager::AddStoredOption<int>
            (in_stack_fffffffffffffda0,(char *)name,description,&value->first_,
             (int)((ulong)this_02 >> 0x20),(int)this_02);
  EnvKeeper::GetEnv(this_00);
  SolverOptionManager::AddOption<int>
            ((SolverOptionManager *)
             CONCAT17(in_stack_fffffffffffffd47,
                      CONCAT16(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40)),
             (char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
             (char *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,0,0x672d21);
  EnvKeeper::GetEnv(this_00);
  SolverOptionManager::AddStoredOption<int>
            (in_stack_fffffffffffffda0,(char *)name,description,&value->first_,
             (int)((ulong)this_02 >> 0x20),(int)this_02);
  EnvKeeper::GetEnv(this_00);
  SolverOptionManager::AddOption<double>
            (in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48,
             (char *)CONCAT17(in_stack_fffffffffffffd47,
                              CONCAT16(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40)),
             (double *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
             (double)in_stack_fffffffffffffd30,(double)in_stack_fffffffffffffd28);
  EnvKeeper::GetEnv(this_00);
  SolverOptionManager::AddOption<double>
            (in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48,
             (char *)CONCAT17(in_stack_fffffffffffffd47,
                              CONCAT16(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40)),
             (double *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
             (double)in_stack_fffffffffffffd30,(double)in_stack_fffffffffffffd28);
  EnvKeeper::GetEnv(this_00);
  SolverOptionManager::AddOption<double>
            (in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48,
             (char *)CONCAT17(in_stack_fffffffffffffd47,
                              CONCAT16(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40)),
             (double *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
             (double)in_stack_fffffffffffffd30,(double)in_stack_fffffffffffffd28);
  EnvKeeper::GetEnv(this_00);
  SolverOptionManager::AddOption<bool>
            (in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58,
             (char *)in_stack_fffffffffffffd50,(bool *)in_stack_fffffffffffffd48,
             (bool)in_stack_fffffffffffffd47,(bool)in_stack_fffffffffffffd46);
  EnvKeeper::GetEnv(this_00);
  std::__cxx11::string::c_str();
  SolverOptionManager::AddOption<bool>
            (in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58,
             (char *)in_stack_fffffffffffffd50,(bool *)in_stack_fffffffffffffd48,
             (bool)in_stack_fffffffffffffd47,(bool)in_stack_fffffffffffffd46);
  EnvKeeper::GetEnv(this_00);
  SolverOptionManager::AddOption<int>
            ((SolverOptionManager *)
             CONCAT17(in_stack_fffffffffffffd47,
                      CONCAT16(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40)),
             (char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
             (char *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,0,0x672f3a);
  EnvKeeper::GetEnv(this_00);
  SolverOptionManager::AddOption<int>
            ((SolverOptionManager *)
             CONCAT17(in_stack_fffffffffffffd47,
                      CONCAT16(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40)),
             (char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
             (char *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,0,0x672f80);
  pEVar2 = EnvKeeper::GetEnv(this_00);
  ifCanReplace = (undefined1)((ulong)&pEVar2->super_SolveResultRegistry >> 0x38);
  local_19a = 1;
  local_178 = local_170;
  sm = (SRRegMap *)local_199;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68,
             (allocator<char> *)in_stack_fffffffffffffd60);
  SolveResultRegistry::RegEntry::RegEntry
            ((RegEntry *)
             CONCAT17(in_stack_fffffffffffffd47,
                      CONCAT16(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40)),
             in_stack_fffffffffffffd3c,(string *)in_stack_fffffffffffffd30);
  local_19a = 0;
  local_148 = local_170;
  local_140 = 1;
  __a = local_19c;
  std::allocator<mp::SolveResultRegistry::RegEntry>::allocator
            ((allocator<mp::SolveResultRegistry::RegEntry> *)0x673036);
  __l._M_len = (size_type)description;
  __l._M_array = value;
  std::
  set<mp::SolveResultRegistry::RegEntry,_std::less<mp::SolveResultRegistry::RegEntry>,_std::allocator<mp::SolveResultRegistry::RegEntry>_>
  ::set((set<mp::SolveResultRegistry::RegEntry,_std::less<mp::SolveResultRegistry::RegEntry>,_std::allocator<mp::SolveResultRegistry::RegEntry>_>
         *)this_02,__l,(less<mp::SolveResultRegistry::RegEntry> *)this_01,__a);
  SolveResultRegistry::AddSolveResults(this_03,sm,(bool)ifCanReplace);
  std::
  set<mp::SolveResultRegistry::RegEntry,_std::less<mp::SolveResultRegistry::RegEntry>,_std::allocator<mp::SolveResultRegistry::RegEntry>_>
  ::~set((set<mp::SolveResultRegistry::RegEntry,_std::less<mp::SolveResultRegistry::RegEntry>,_std::allocator<mp::SolveResultRegistry::RegEntry>_>
          *)0x673088);
  std::allocator<mp::SolveResultRegistry::RegEntry>::~allocator
            ((allocator<mp::SolveResultRegistry::RegEntry> *)0x673095);
  pppuVar4 = (undefined8 ***)local_170;
  pppuVar3 = &local_148;
  do {
    pppuVar3 = pppuVar3 + -5;
    SolveResultRegistry::RegEntry::~RegEntry((RegEntry *)0x6730be);
  } while (pppuVar3 != pppuVar4);
  std::__cxx11::string::~string((string *)(local_199 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_199);
  return;
}

Assistant:

void InitOwnOptions() {
    /// Should be called after adding all constraint keepers
    FlatModel::ConsiderAcceptanceOptions(*this, GetModelAPI(), GetEnv());

    GetEnv().AddStoredOption("tech:writegraph cvt:writegraph writegraph exportgraph",
        "File to export conversion graph. Format: JSON Lines.",
        options_.file_graph_export_);
    GetEnv().AddOption("cvt:pre:all",
        "0/1*: Set to 0 to disable most presolve in the flat converter.",
        options_.preprocessAnything_, 0, 1);
    GetEnv().AddOption("cvt:pre:eqresult",
        "0/1*: Preprocess reified equality comparison's decidable cases.",
        options_.preprocessEqualityResultBounds_, 0, 1);
    GetEnv().AddOption("cvt:pre:eqbinary",
        "0/1*: Preprocess reified equality comparison with a binary variable.",
        options_.preprocessEqualityBvar_, 0, 1);
    GetEnv().AddOption("cvt:pre:ineqresult",
                       "0/1*: Preprocess reified inequality comparison's decidable cases.",
                       options_.preprocessInequalityResultBounds_, 0, 1);
    GetEnv().AddOption("cvt:pre:ineqrhs",
                       "0/1*: Preprocess reified inequality comparison's right-hand sides.",
                       options_.preprocessInequalityRhs_, 0, 1);
    GetEnv().AddOption("cvt:pre:unnest",
        "0/1*: Inline nested expressions, currently Ands/Ors.",
        options_.preproNestedAndOrs_, 0, 1);

    GetEnv().AddOption("cvt:quadobj passquadobj",
                       ModelAPIAcceptsQuadObj() ?
        "0/1*: Pass quadratic objective terms to the solver. "
        "When 0, if the solver accepts quadratic constraints, "
                                                "such a constraint will be created with those, "
                                                "otherwise linearly approximated."
                       :
        "0*/1: Pass quadratic objective terms to the solver. "
                                                  "When 0, if the solver accepts quadratic constraints, "
                                                  "such a constraint will be created with those, "
                                                  "otherwise linearly approximated.",
        options_.passQuadObj_, 0, 1);
    GetEnv().AddOption("cvt:quadcon passquadcon",
                       "Convenience option. "
                       "Set to 0 to disable quadratic constraints. "
                       "Synonym for acc:quad..=0. "
                       "Currently this disables out-multiplication "
                       "of quadratic terms, then they are linearized.",
                       options_.passQuadCon_, 0, 1);
    GetEnv().AddOption("cvt:qp2passes cvt:qp2pass qp2passes qp2pass",
                       "Parse sums of QP expressions in 2 passes. "
                       "Usually faster. Default 1.",
                       options_.useQP2Pass_, 0, 1);
    GetEnv().AddOption("cvt:multoutcard multoutcard",
                       "Up to which (estimated) QP matrix cardinality "
                       "should a product of 2 linear expressions "
                       "be multiplied out. Default 1e9.\n"
                       "\n"
                       "Can speed up model input, but prone to "
                       "numerical issues.",
                       options_.QPMultOutCard_, 0.0, 1e20);


    GetEnv().AddOption("cvt:expcones expcones",
                       ModelAPIAcceptsExponentialCones() ?
                         "0/1*: Recognize exponential cones." :
                         "0*/1: Recognize exponential cones.",
                       options_.passExpCones_, 0, 1);
    options_.passExpCones_ = ModelAPIAcceptsExponentialCones();
    // Should be after construction
    socp_mode_text_ =
      "Second-Order Cone recognition mode:\n"
      "\n.. value-table::\n"
      "Recognized SOCP forms can be further converted to "
      "(SOCP-standardized) quadratic constraints, see cvt:socp2qc. "
      "Default: " + std::to_string(DefaultSOCPMode()) + ".";
    GetEnv().AddStoredOption("cvt:socp socpmode socp",
                       socp_mode_text_.c_str(),
                       options_.passSOCPCones_, socp_values_);
    options_.passSOCPCones_ = DefaultSOCPMode();
    socp2qc_mode_text_ =
      "Mode to convert recognized SOCP forms to "
      "SOCP-standardized quadratic constraints:\n"
      "\n.. value-table::\n"
      "Such conversion can be necessary "
      "if the solver does not accept "
      "a mix of conic and quadratic constraints/objectives. "
      "Default: " + std::to_string(DefaultSOCP2QCMode()) + ".";
    GetEnv().AddStoredOption("cvt:socp2qc socp2qcmode socp2qc",
                       socp2qc_mode_text_.c_str(),
                       options_.passSOCP2QC_, socp2qc_values_);
    options_.passSOCP2QC_ = DefaultSOCP2QCMode();

    GetEnv().AddStoredOption("acc:_all",
                             "Solver acceptance level for all "
                             "constraints and expressions. "
                             "Value meaning: as described in the specific "
                             "acc:... options.\n"
                             "\n"
                             "Can be useful to disable all reformulations (acc:_all=2), "
                             "or force linearization (acc:_all=0.)",
                             options_.accAll_, 0, 4);

    if constexpr (IfAcceptingNLOutput())
      GetEnv().AddStoredOption("acc:_expr",
                        fmt::format(
                            "Solver acceptance level for all expressions, "
                            "default {}:\n\n.. value-table::",
                                   options_.accExpr_).c_str(),
                        options_.accExpr_, values_allexpr_acceptance_);
    else
      GetEnv().AddStoredOption("acc:_expr", "HIDDEN", options_.accExpr_, 0, 1);

    GetEnv().AddOption("alg:relax relax",
        "0*/1: Whether to relax integrality of variables.",
        options_.relax_, 0, 1);

    GetEnv().AddStoredOption(
          "sol:chk:mode solcheck checkmode chk:mode",
        "Solution checking mode. "
        "Sum of a subset of the following bits:\n"
        "\n"
        "| 1 - Check variable bounds and integrality.\n"
        "| 2 - Check original model constraints, as well as "
        "      any non-linear expression values "
        "      reported by the solver.\n"
        "| 4 - Check intermediate auxiliary constraints "
        "      (i.e., those which were reformulated further).\n"
        "| 8 - Check final auxiliary constraints sent to solver.\n"
        "| 16 - Check objective values.\n"
        "| 32, 64, 128, 256, 512 - similar, but "
        "      non-linear expressions are recomputed "
        "      (vs using their values reported by the solver.) "
        "      *Experimental.* This is an idealistic check, because "
        "      it does not consider possible tolerances "
        "      applied by the solver when computing "
        "      expression values.\n"
                             "\n"
                             "Default: 1+2+512.",
        options_.solcheckmode_, 0, 1023);
    GetEnv().AddOption("sol:chk:feastol sol:chk:eps chk:eps chk:feastol",
        "Absolute tolerance to check objective values, variable "
        "and constraint bounds. Default 1e-6.",
        options_.solfeastol_, 0.0, 1e100);
    GetEnv().AddOption("sol:chk:feastolrel sol:chk:epsrel chk:epsrel chk:feastolrel",
        "Relative tolerance to check objective values, variable "
        "and constraint bounds. Default 1e-6.",
        options_.solfeastolrel_, 0.0, 1e100);
    GetEnv().AddOption("sol:chk:inttol sol:chk:inteps sol:inteps chk:inttol",
        "Solution checking tolerance for variables' integrality. "
        "Default 1e-5.",
        options_.solinttol_, 0.0, 1e100);
    GetEnv().AddOption("sol:chk:infeas chk:infeas checkinfeas",
                       "Check even infeasible solution condidates, "
                       "whenever solver reports them.",
                       options_.solcheckinfeas_, false, true);
    GetEnv().AddOption("sol:chk:fail chk:fail checkfail",
                       solchkfailtext_.c_str(),
                       options_.solcheckfail_, false, true);
    GetEnv().AddOption("sol:chk:round chk:round chk:rnd",
        "AMPL solution_round option when checking: "
                       "round to this number of decimals after comma "
                       "(before comma if negative.)",
                       options_.sol_round_, -1000, 1000);
    GetEnv().AddOption("sol:chk:prec chk:prec chk:precision",
        "AMPL solution_precision option when checking: "
                       "number of significant digits.",
                       options_.sol_prec_, -1000, 1000);

    ////////////////////// Solve result codes ////////////////////////
    GetEnv().AddSolveResults({
                               {sol::MP_SOLUTION_CHECK,
                                "solved? MP solution check failed "
                                "(option sol:chk:fail) "}
                             });
  }